

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  long in_RSI;
  int in_EDI;
  HighwayHashCatT<1U> cat;
  HHStateT<1> state;
  HHResult64 result;
  size_t size;
  char *in;
  HHKey key;
  HighwayHashCatT<1U> HStack_200;
  HHStatePortable local_118;
  ulong local_98;
  size_t local_90;
  char *local_88;
  uint64_t local_80 [5];
  uint local_54;
  
  local_54 = 0;
  if (in_EDI == 2) {
    local_80[0] = 1;
    local_80[1] = 2;
    local_80[2] = 3;
    local_80[3] = 4;
    local_88 = *(char **)(in_RSI + 8);
    local_90 = strlen(local_88);
    highwayhash::Portable::HHStatePortable::HHStatePortable(&local_118,local_80);
    highwayhash::HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
              (&local_118,local_88,local_90,&local_98);
    poVar1 = std::operator<<((ostream *)&std::cout,"Hash   : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_98);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    highwayhash::HighwayHashCatT<1U>::HighwayHashCatT(&HStack_200,(HHKey *)local_80);
    highwayhash::HighwayHashCatT<1U>::Append(&HStack_200,local_88,local_90);
    highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(&HStack_200,&local_98);
    poVar1 = std::operator<<((ostream *)&std::cout,"HashCat: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_98);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Please provide 1 argument with a text to hash");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_54 = (uint)(in_EDI != 2);
  return local_54;
}

Assistant:

int main(int argc, char* argv[]) {
  // We read from the args on purpose, to ensure a compile time constant will
  // not be used, for verifying assembly on the supported platforms.
  if (argc != 2) {
    std::cout << "Please provide 1 argument with a text to hash" << std::endl;
    return 1;
  }

  // Please use a different key to ensure your hashes aren't identical.
  HH_ALIGNAS(32) const HHKey key = {1, 2, 3, 4};

  // Aligning inputs to 32 bytes may help but is not required.
  const char* in = argv[1];
  const size_t size = strlen(in);

  // Type determines the hash size; can also be HHResult128 or HHResult256.
  HHResult64 result;

  // HH_TARGET_PREFERRED expands to the best specialization available for the
  // CPU detected via compiler flags (e.g. AVX2 #ifdef __AVX2__).
  HHStateT<HH_TARGET_PREFERRED> state(key);
  HighwayHashT(&state, in, size, &result);
  std::cout << "Hash   : " << result << std::endl;

  HighwayHashCatT<HH_TARGET_PREFERRED> cat(key);
  cat.Append(in, size);
  cat.Finalize(&result);
  std::cout << "HashCat: " << result << std::endl;
  return 0;
}